

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

void __thiscall
ncnn::ConvolutionDepthWise1D::make_padding
          (ConvolutionDepthWise1D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,int _kernel_w,
          Option *opt)

{
  int *piVar1;
  float v;
  int iVar2;
  int in_ECX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  void *in_R8;
  Option opt_b_2;
  int wpad_1;
  Option opt_b_1;
  int wpad;
  Option opt_b;
  int kernel_extent_w;
  int w;
  undefined1 local_138 [12];
  float v_00;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  Mat *in_stack_fffffffffffffee8;
  Mat *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined1 local_f0 [8];
  undefined8 local_e8;
  int local_ac;
  undefined1 local_a8 [8];
  undefined8 local_a0;
  int local_68;
  int local_64;
  void *local_60;
  int local_38;
  undefined4 local_34;
  undefined8 *local_30;
  int local_18;
  undefined4 local_14;
  void *local_8;
  
  v_00 = (float)((ulong)stack0xfffffffffffffed0 >> 0x20);
  local_64 = *(int *)((long)in_RSI + 0x2c);
  local_68 = *(int *)(in_RDI + 0xd8) * (in_ECX + -1) + 1;
  local_60 = in_R8;
  if (in_RDX != in_RSI) {
    if (in_RSI[1] != 0) {
      piVar1 = (int *)in_RSI[1];
      local_34 = 1;
      LOCK();
      local_38 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_30 = in_RSI;
    if (in_RDX[1] != 0) {
      piVar1 = (int *)in_RDX[1];
      local_14 = 0xffffffff;
      LOCK();
      local_18 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_18 == 1) {
        if (in_RDX[4] == 0) {
          local_8 = (void *)*in_RDX;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
        }
      }
    }
    *in_RDX = 0;
    in_RDX[2] = 0;
    *(undefined4 *)(in_RDX + 3) = 0;
    *(undefined4 *)(in_RDX + 5) = 0;
    *(undefined4 *)((long)in_RDX + 0x2c) = 0;
    *(undefined4 *)(in_RDX + 6) = 0;
    *(undefined4 *)((long)in_RDX + 0x34) = 0;
    *(undefined4 *)(in_RDX + 7) = 0;
    in_RDX[8] = 0;
    in_RDX[1] = 0;
    *in_RDX = *local_30;
    in_RDX[1] = local_30[1];
    in_RDX[2] = local_30[2];
    *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(local_30 + 3);
    in_RDX[4] = local_30[4];
    *(undefined4 *)(in_RDX + 5) = *(undefined4 *)(local_30 + 5);
    *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_30 + 0x2c);
    *(undefined4 *)(in_RDX + 6) = *(undefined4 *)(local_30 + 6);
    *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_30 + 0x34);
    *(undefined4 *)(in_RDX + 7) = *(undefined4 *)(local_30 + 7);
    in_RDX[8] = local_30[8];
  }
  if ((*(int *)(in_RDI + 0xe0) < 1) && (*(int *)(in_RDI + 0xe4) < 1)) {
    if ((*(int *)(in_RDI + 0xe0) == -0xe9) && (*(int *)(in_RDI + 0xe4) == -0xe9)) {
      local_ac = (local_68 + ((local_64 + -1) / *(int *)(in_RDI + 0xdc)) * *(int *)(in_RDI + 0xdc))
                 - local_64;
      if (0 < local_ac) {
        memcpy(local_f0,local_60,0x40);
        local_e8 = *(undefined8 *)((long)local_60 + 0x10);
        copy_make_border(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
                         in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                         in_stack_ffffffffffffff00,v_00,
                         (Option *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      }
    }
    else if ((*(int *)(in_RDI + 0xe0) == -0xea) &&
            ((*(int *)(in_RDI + 0xe4) == -0xea &&
             (iVar2 = (local_68 +
                      ((local_64 + -1) / *(int *)(in_RDI + 0xdc)) * *(int *)(in_RDI + 0xdc)) -
                      local_64, 0 < iVar2)))) {
      memcpy(local_138,local_60,0x40);
      v_00 = (float)((ulong)*(undefined8 *)((long)local_60 + 0x10) >> 0x20);
      v = v_00;
      unique0x100003a2 = *(undefined8 *)((long)local_60 + 0x10);
      copy_make_border(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4
                       ,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                       in_stack_fffffffffffffed8,in_stack_ffffffffffffff00,v,
                       (Option *)CONCAT44(iVar2,in_stack_ffffffffffffff08));
    }
  }
  else {
    memcpy(local_a8,local_60,0x40);
    local_a0 = *(undefined8 *)((long)local_60 + 0x10);
    copy_make_border(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                     in_stack_ffffffffffffff00,v_00,
                     (Option *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  return;
}

Assistant:

void ConvolutionDepthWise1D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, int _kernel_w, const Option& opt) const
{
    int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}